

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O0

void __thiscall flow::TargetCodeGenerator::pop(TargetCodeGenerator *this,size_t count)

{
  FILE *__stream;
  size_type sVar1;
  undefined8 uVar2;
  size_t local_58;
  size_t i;
  allocator<char> local_39;
  string local_38 [32];
  size_t local_18;
  size_t count_local;
  TargetCodeGenerator *this_local;
  
  local_18 = count;
  count_local = (size_t)this;
  sVar1 = std::deque<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>::size(&this->stack_)
  ;
  __stream = _stderr;
  if (sVar1 < count) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_38,"flow: BUG: stack smaller than amount of elements to pop.",&local_39);
    uVar2 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s\n",uVar2);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
    abort();
  }
  for (local_58 = 0; local_58 != local_18; local_58 = local_58 + 1) {
    std::deque<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>::pop_back(&this->stack_);
  }
  return;
}

Assistant:

void TargetCodeGenerator::pop(size_t count) {
  FLOW_ASSERT(count <= stack_.size(), "flow: BUG: stack smaller than amount of elements to pop.");

  for (size_t i = 0; i != count; i++)
    stack_.pop_back();
}